

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

void __thiscall Connection::queueBind(Connection *this,string *name)

{
  ssize_t sVar1;
  PostmanConnectionException *pPVar2;
  uint8_t tag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  tag = '\x02';
  if (0xff < name->_M_string_length) {
    pPVar2 = (PostmanConnectionException *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_58,0xff);
    std::operator+(&local_f8,"Name must be less than ",&local_58);
    std::operator+(&local_38,&local_f8," characters.");
    PostmanConnectionException::PostmanConnectionException(pPVar2,&local_38);
    __cxa_throw(pPVar2,&PostmanConnectionException::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::resize((ulong)name);
  sVar1 = write(this->_socket,&tag,1);
  if (sVar1 < 0) {
    pPVar2 = (PostmanConnectionException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_78,"Cannot send binding tag.",(allocator *)&local_f8);
    PostmanConnectionException::PostmanConnectionException(pPVar2,&local_78);
    __cxa_throw(pPVar2,&PostmanConnectionException::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar1 = write(this->_socket,(name->_M_dataplus)._M_p,0xff);
  if (sVar1 < 0) {
    pPVar2 = (PostmanConnectionException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_98,"Cannot send bind name.",(allocator *)&local_f8);
    PostmanConnectionException::PostmanConnectionException(pPVar2,&local_98);
    __cxa_throw(pPVar2,&PostmanConnectionException::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar1 = read(this->_socket,&tag,1);
  if (-1 < sVar1) {
    if (tag == '\x03') {
      this->_isBound = true;
      return;
    }
    pPVar2 = (PostmanConnectionException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_d8,"The queue doesn\'t exist.",(allocator *)&local_f8);
    PostmanConnectionException::PostmanConnectionException(pPVar2,&local_d8);
    __cxa_throw(pPVar2,&PostmanConnectionException::typeinfo,std::runtime_error::~runtime_error);
  }
  pPVar2 = (PostmanConnectionException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_b8,"Didn\'t recieve tag.",(allocator *)&local_f8);
  PostmanConnectionException::PostmanConnectionException(pPVar2,&local_b8);
  __cxa_throw(pPVar2,&PostmanConnectionException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Connection::queueBind(std::string name) {
  uint8_t tag = static_cast<uint8_t>(MessageTag::queueBind);
  if (name.size() > queueNameSize) {
    throw PostmanConnectionException("Name must be less than " +
                                     std::to_string(queueNameSize) +
                                     " characters.");
  }

  name.resize(queueNameSize);
  if (write(_socket, &tag, 1) < 0) {
    throw PostmanConnectionException("Cannot send binding tag.");
  }

  if (write(_socket, name.data(), queueNameSize) < 0) {
    throw PostmanConnectionException("Cannot send bind name.");
  }

  if (read(_socket, &tag, 1) < 0) {
    throw PostmanConnectionException("Didn't recieve tag.");
  }

  if (MessageTag(tag) == MessageTag::ack) {
    this->_isBound = true;
  } else {
    throw PostmanConnectionException("The queue doesn't exist.");
  }
}